

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QCalendarPopup::setCalendarWidget(QCalendarPopup *this,QCalendarWidget *cw)

{
  Data *pDVar1;
  QLayout *this_00;
  Data *pDVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QMargins local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::layout(&this->super_QWidget);
  this_00 = (QLayout *)QMetaObject::cast((QObject *)&QVBoxLayout::staticMetaObject);
  if (this_00 == (QLayout *)0x0) {
    this_00 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00,&this->super_QWidget);
    local_38.m_left.m_i = 0;
    local_38.m_top.m_i = 0;
    local_38.m_right.m_i = 0;
    local_38.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_38);
    (**(code **)(*(long *)this_00 + 0x68))(this_00,0);
  }
  pDVar2 = (this->calendar).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->calendar).wp.value;
  }
  if (pQVar3 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  if (cw == (QCalendarWidget *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else {
    pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)cw);
  }
  pDVar1 = (this->calendar).wp.d;
  (this->calendar).wp.d = pDVar2;
  (this->calendar).wp.value = (QObject *)cw;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  QBoxLayout::addWidget((QBoxLayout *)this_00,&cw->super_QWidget,0,(Alignment)0x0);
  QObject::connect(local_40,(char *)cw,(QObject *)"2activated(QDate)",(char *)this,0x6e3b0b);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)cw,(QObject *)"2clicked(QDate)",(char *)this,0x6e3b0b);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,(char *)cw,(QObject *)"2selectionChanged()",(char *)this,0x6e3b34);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QWidget::setFocus(&cw->super_QWidget,OtherFocusReason);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::setCalendarWidget(QCalendarWidget *cw)
{
    Q_ASSERT(cw);
    QVBoxLayout *widgetLayout = qobject_cast<QVBoxLayout*>(layout());
    if (!widgetLayout) {
        widgetLayout = new QVBoxLayout(this);
        widgetLayout->setContentsMargins(QMargins());
        widgetLayout->setSpacing(0);
    }
    delete calendar.data();
    calendar = QPointer<QCalendarWidget>(cw);
    widgetLayout->addWidget(cw);

    connect(cw, SIGNAL(activated(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(clicked(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(selectionChanged()), this, SLOT(dateSelectionChanged()));

    cw->setFocus();
}